

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

string * __thiscall
slang::CommandLine::findNearestMatch_abi_cxx11_(CommandLine *this,string_view arg)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  char *in_RCX;
  size_t in_RDX;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  string *in_RDI;
  int in_stack_00000008;
  bool in_stack_0000000f;
  undefined1 in_stack_00000010 [16];
  string_view in_stack_00000020;
  int dist;
  type *value;
  type *key;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>_>
  *__range1;
  int bestDistance;
  string_view bestName;
  size_t equalsIndex;
  undefined7 in_stack_fffffffffffffe78;
  char in_stack_fffffffffffffe7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *__pos;
  allocator<char> local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  allocator<char> local_f9 [65];
  __sv_type local_b8;
  size_t local_a8;
  char *local_a0;
  __sv_type local_98;
  int local_84;
  type *local_80;
  type *local_78;
  reference local_70;
  _Self local_68;
  _Self local_60;
  basic_string_view<char,_std::char_traits<char>_> *local_58;
  int local_4c;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  size_type local_28;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  __pos = in_RDI;
  local_18._M_len = in_RDX;
  local_18._M_str = in_RCX;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_18);
  if (sVar2 < 3) {
    std::__cxx11::string::string(in_RDI);
  }
  else {
    local_28 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          in_stack_fffffffffffffe80,in_stack_fffffffffffffe7f,0x59ec09);
    if (local_28 != 0xffffffffffffffff) {
      local_38 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (in_RSI,(size_type)__pos,(size_type)in_RDI);
      local_18._M_len = local_38._M_len;
      local_18._M_str = local_38._M_str;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48);
    local_4c = 5;
    local_58 = in_RSI + 1;
    local_60._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>_>
         ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>_>
                  *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    local_68._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>_>
                *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
    while (bVar1 = std::operator==(&local_60,&local_68), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_70 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>
                 ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>
                              *)0x59ece5);
      local_78 = std::
                 get<0ul,std::__cxx11::string_const,std::shared_ptr<slang::CommandLine::Option>>
                           ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>
                             *)0x59ecfa);
      local_80 = std::
                 get<1ul,std::__cxx11::string_const,std::shared_ptr<slang::CommandLine::Option>>
                           ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>
                             *)0x59ed0f);
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](in_stack_fffffffffffffe80,
                          CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
      if (*pvVar3 != '+') {
        local_98 = std::__cxx11::string::operator_cast_to_basic_string_view
                             (in_stack_fffffffffffffe80);
        local_a8 = local_18._M_len;
        local_a0 = local_18._M_str;
        local_84 = editDistance(in_stack_00000020,(string_view)in_stack_00000010,in_stack_0000000f,
                                in_stack_00000008);
        if (local_84 < local_4c) {
          local_b8 = std::__cxx11::string::operator_cast_to_basic_string_view
                               (in_stack_fffffffffffffe80);
          local_48._M_len = local_b8._M_len;
          local_48._M_str = local_b8._M_str;
          local_4c = local_84;
        }
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>
      ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<slang::CommandLine::Option>_>_>
                    *)in_stack_fffffffffffffe80);
    }
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_48);
    if (bVar1) {
      std::__cxx11::string::string(in_RDI);
    }
    else {
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_48);
      if (sVar2 == 1) {
        s_abi_cxx11_((char *)in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffec0,
                   (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb8,
                   (allocator<char> *)in_stack_fffffffffffffeb0);
        std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
        std::__cxx11::string::~string(in_stack_fffffffffffffe80);
        std::allocator<char>::~allocator(local_f9);
        std::__cxx11::string::~string(in_stack_fffffffffffffe80);
      }
      else {
        s_abi_cxx11_((char *)in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
        this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_151;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffec0,
                   (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffeb8,
                   (allocator<char> *)in_stack_fffffffffffffeb0);
        std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
        std::__cxx11::string::~string(this_00);
        std::allocator<char>::~allocator(&local_151);
        std::__cxx11::string::~string(this_00);
      }
    }
  }
  return __pos;
}

Assistant:

std::string CommandLine::findNearestMatch(std::string_view arg) const {
    if (arg.length() <= 2)
        return {};

    size_t equalsIndex = arg.find_first_of('=');
    if (equalsIndex != std::string_view::npos)
        arg = arg.substr(0, equalsIndex);

    std::string_view bestName;
    int bestDistance = 5;

    for (auto& [key, value] : optionMap) {
        if (key[0] == '+')
            continue;

        int dist = editDistance(key, arg, /* allowReplacements */ true, bestDistance);
        if (dist < bestDistance) {
            bestName = key;
            bestDistance = dist;
        }
    }

    if (bestName.empty())
        return {};

    if (bestName.length() == 1)
        return "-"s + std::string(bestName);

    return "--"s + std::string(bestName);
}